

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O1

void __thiscall inipp::Ini<char>::Ini(Ini<char> *this)

{
  _Rb_tree_header *p_Var1;
  undefined1 local_19;
  
  p_Var1 = &(this->sections)._M_t._M_impl.super__Rb_tree_header;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->sections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->errors).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->errors;
  (this->errors).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->errors;
  (this->errors).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__shared_ptr<inipp::Format<char>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<inipp::Format<char>>>
            ((__shared_ptr<inipp::Format<char>,(__gnu_cxx::_Lock_policy)2> *)&this->format,
             (allocator<inipp::Format<char>_> *)&local_19);
  return;
}

Assistant:

void generate(std::basic_ostream<CharT>& os) const {
		for (auto const & sec : sections) {
			os << format->char_section_start << sec.first << format->char_section_end << std::endl;
			for (auto const & val : sec.second) {
				os << val.first << format->char_assign << val.second << std::endl;
			}
			os << std::endl;
		}
	}